

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::peer_list::ban_peer(peer_list *this,torrent_peer *p)

{
  bool bVar1;
  torrent_peer *p_local;
  peer_list *this_local;
  
  bVar1 = is_connect_candidate(this,p);
  if (bVar1) {
    update_connect_candidates(this,-1);
  }
  *(uint *)&p->field_0x1b = *(uint *)&p->field_0x1b & 0xf7ffffff | 0x8000000;
  return true;
}

Assistant:

bool peer_list::ban_peer(torrent_peer* p)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);

		if (is_connect_candidate(*p))
			update_connect_candidates(-1);

		p->banned = true;
		TORRENT_ASSERT(!is_connect_candidate(*p));
		return true;
	}